

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tga.cpp
# Opt level: O0

Ref<embree::Image> embree::loadTGA(FileName *fileName)

{
  undefined8 uVar1;
  char *pcVar2;
  runtime_error *prVar3;
  _func_int **pp_Var4;
  string *name;
  ulong height_00;
  Image *in_RDI;
  uchar r;
  uchar g;
  uchar b;
  size_t x;
  size_t y;
  uchar desc;
  uchar bits;
  unsigned_short height;
  unsigned_short width;
  unsigned_short yorg;
  unsigned_short xorg;
  uchar cmd;
  unsigned_short cml;
  unsigned_short cmo;
  uchar datatype;
  uchar colormaptype;
  uchar idlength;
  fstream file;
  Ref<embree::Image> *img;
  FileName *in_stack_fffffffffffffc18;
  fstream *in_stack_fffffffffffffc20;
  ImageT<embree::Col4<float>_> *in_stack_fffffffffffffc68;
  float local_308;
  float fStack_304;
  float fStack_300;
  undefined4 uStack_2fc;
  byte local_2eb;
  byte local_2ea;
  byte local_2e9;
  ulong local_2e8;
  ulong local_2e0;
  undefined1 local_2d1;
  string local_2d0 [39];
  undefined1 local_2a9;
  uchar local_2a8;
  uchar local_2a7;
  unsigned_short local_2a6;
  unsigned_short local_2a4;
  unsigned_short local_2a2;
  unsigned_short local_2a0;
  uchar local_29d;
  unsigned_short local_29c;
  unsigned_short local_29a;
  uchar local_297;
  uchar local_296;
  uchar local_295;
  long local_288 [68];
  _func_int **local_68;
  undefined4 local_50;
  float local_4c;
  float local_48;
  float local_44;
  float *local_40;
  undefined8 local_28;
  undefined8 uStack_20;
  float local_10;
  float local_c;
  float local_8;
  undefined4 local_4;
  
  std::fstream::fstream(local_288);
  uVar1 = *(undefined8 *)(local_288[0] + -0x18);
  std::operator|(_S_failbit,_S_badbit);
  std::ios::exceptions((int)local_288 + (int)uVar1);
  pcVar2 = FileName::c_str((FileName *)0x42451e);
  std::operator|(_S_in,_S_bin);
  std::fstream::open((char *)local_288,(_Ios_Openmode)pcVar2);
  local_295 = fread_uchar(in_stack_fffffffffffffc20);
  if (local_295 != '\0') {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"unsupported TGA file");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_296 = fread_uchar(in_stack_fffffffffffffc20);
  if (local_296 != '\0') {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"unsupported TGA file");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_297 = fread_uchar(in_stack_fffffffffffffc20);
  if (local_297 != '\x02') {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"unsupported TGA file");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_29a = fread_ushort(in_stack_fffffffffffffc20);
  local_29c = fread_ushort(in_stack_fffffffffffffc20);
  local_29d = fread_uchar(in_stack_fffffffffffffc20);
  local_2a0 = fread_ushort(in_stack_fffffffffffffc20);
  local_2a2 = fread_ushort(in_stack_fffffffffffffc20);
  if ((((local_29a == 0) && (local_29c == 0)) && (local_29d == '\0')) &&
     ((local_2a0 == 0 && (local_2a2 == 0)))) {
    local_2a4 = fread_ushort(in_stack_fffffffffffffc20);
    local_2a6 = fread_ushort(in_stack_fffffffffffffc20);
    local_2a7 = fread_uchar(in_stack_fffffffffffffc20);
    if (local_2a7 != '\x18') {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"unsupported TGA file bits per pixel");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_2a8 = fread_uchar(in_stack_fffffffffffffc20);
    if (local_2a8 == ' ') {
      local_2a9 = 0;
      pp_Var4 = (_func_int **)::operator_new(0x48);
      local_2d1 = 1;
      name = (string *)(ulong)local_2a4;
      height_00 = (ulong)local_2a6;
      FileName::operator_cast_to_string(in_stack_fffffffffffffc18);
      ImageT<embree::Col4<float>_>::ImageT(in_stack_fffffffffffffc68,(size_t)pp_Var4,height_00,name)
      ;
      local_2d1 = 0;
      (in_RDI->super_RefCount)._vptr_RefCount = pp_Var4;
      local_68 = pp_Var4;
      if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
        (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
      }
      std::__cxx11::string::~string(local_2d0);
      for (local_2e0 = 0; local_2e0 < local_2a6; local_2e0 = local_2e0 + 1) {
        for (local_2e8 = 0; local_2e8 < local_2a4; local_2e8 = local_2e8 + 1) {
          local_2e9 = fread_uchar(in_stack_fffffffffffffc20);
          local_2ea = fread_uchar(in_stack_fffffffffffffc20);
          local_2eb = fread_uchar(in_stack_fffffffffffffc20);
          pp_Var4 = (in_RDI->super_RefCount)._vptr_RefCount;
          local_44 = (float)local_2eb / 255.0;
          local_48 = (float)local_2ea / 255.0;
          local_4c = (float)local_2e9 / 255.0;
          local_40 = &local_308;
          local_50 = 0x3f800000;
          local_4 = 0x3f800000;
          local_28 = CONCAT44(local_48,local_44);
          uStack_20 = CONCAT44(0x3f800000,local_4c);
          uStack_2fc = 0x3f800000;
          local_10 = local_44;
          local_c = local_48;
          local_8 = local_4c;
          local_308 = local_44;
          fStack_304 = local_48;
          fStack_300 = local_4c;
          (**(code **)(*pp_Var4 + 0x28))(pp_Var4,local_2e8,local_2e0,&local_308);
        }
      }
      local_2a9 = 1;
      std::fstream::~fstream(local_288);
      return (Ref<embree::Image>)in_RDI;
    }
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"unsupported TGA file");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar3,"unsupported TGA file");
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Ref<Image> loadTGA(const FileName& fileName)
  {
    /* open file for reading */
    std::fstream file;
    file.exceptions (std::fstream::failbit | std::fstream::badbit);
    file.open (fileName.c_str(), std::fstream::in | std::fstream::binary);

    unsigned char idlength = fread_uchar(file);
    if (idlength != 0) THROW_RUNTIME_ERROR("unsupported TGA file");

    unsigned char colormaptype = fread_uchar(file);
    if (colormaptype != 0) THROW_RUNTIME_ERROR("unsupported TGA file");

    unsigned char datatype = fread_uchar(file);
    if (datatype != 2) THROW_RUNTIME_ERROR("unsupported TGA file");

    unsigned short cmo = fread_ushort(file);
    unsigned short cml = fread_ushort(file);
    unsigned char  cmd = fread_uchar(file);
    unsigned short xorg = fread_ushort(file);
    unsigned short yorg = fread_ushort(file);
    if (cmo != 0 || cml != 0 || cmd != 0 || xorg != 0 || yorg != 0)
      THROW_RUNTIME_ERROR("unsupported TGA file");

    unsigned short width = fread_ushort(file);
    unsigned short height = fread_ushort(file);
    
    unsigned char bits = fread_uchar(file);
    if (bits != 3*8) THROW_RUNTIME_ERROR("unsupported TGA file bits per pixel");
    
    unsigned char desc = fread_uchar(file);
    if (desc != 0x20) THROW_RUNTIME_ERROR("unsupported TGA file");

    /* create image and fill with data */
    Ref<Image> img = new Image4f(width,height,fileName);

    /* load image data */
    for (size_t y=0; y<height; y++) {
      for (size_t x=0; x<width; x++) {
        const unsigned char b = fread_uchar(file);
        const unsigned char g = fread_uchar(file);
        const unsigned char r = fread_uchar(file);
        img->set(x,y,Color4(r/255.0f,g/255.0f,b/255.0f,1.0f));
      }
    }

    return img;
  }